

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.c
# Opt level: O1

int UUID_from_string(char *uuid_string,UUID_T *uuid)

{
  byte bVar1;
  uint uVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  
  if (uuid_string == (char *)0x0 || uuid == (UUID_T *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar7 = 0x22;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x22;
    }
    pcVar9 = "Invalid argument (uuid_string=%p, uuid=%p)";
    iVar5 = 0x21;
    pcVar4 = uuid_string;
  }
  else {
    pcVar4 = (char *)strlen(uuid_string);
    if (pcVar4 == (char *)0x24) {
      iVar7 = 0;
      pcVar4 = (char *)0x0;
      lVar8 = 0;
      do {
        bVar1 = uuid_string[(long)pcVar4];
        if (bVar1 == 0x2d) {
          if (((char *)0x17 < pcVar4) || ((0x842100UL >> ((ulong)pcVar4 & 0x3f) & 1) == 0)) {
            p_Var3 = xlogging_get_log_function();
            iVar7 = 0x3f;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return 0x3f;
            }
            pcVar9 = "Failed decoding UUID string (%lu)";
            iVar5 = 0x3e;
            goto LAB_0012a15f;
          }
          pcVar4 = pcVar4 + 1;
        }
        else {
          if ((byte)(bVar1 - 0x30) < 10) {
            uVar2 = bVar1 - 0x30 & 0xff;
          }
          else if ((byte)(bVar1 + 0x9f) < 6) {
            uVar2 = bVar1 - 0x57;
          }
          else {
            uVar2 = 0xffffffff;
            if ((byte)(bVar1 + 0xbf) < 6) {
              uVar2 = bVar1 - 0x37;
            }
          }
          bVar1 = (uuid_string + 1)[(long)pcVar4];
          if ((byte)(bVar1 - 0x30) < 10) {
            uVar6 = (uint)(byte)(bVar1 - 0x30);
          }
          else if ((byte)(bVar1 + 0x9f) < 6) {
            uVar6 = bVar1 - 0x57;
          }
          else {
            uVar6 = 0xffffffff;
            if ((byte)(bVar1 + 0xbf) < 6) {
              uVar6 = bVar1 - 0x37;
            }
          }
          if (uVar6 == 0xffffffff || uVar2 == 0xffffffff) {
            p_Var3 = xlogging_get_log_function();
            iVar7 = 0x56;
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
                        ,"UUID_from_string",0x55,1,"Failed decoding UUID string (%lu)",pcVar4);
            }
          }
          else {
            (*uuid)[lVar8] = (char)uVar6 + (char)(uVar2 << 4);
            pcVar4 = pcVar4 + 2;
            lVar8 = lVar8 + 1;
          }
          if (uVar6 == 0xffffffff || uVar2 == 0xffffffff) {
            return iVar7;
          }
        }
        if ((char *)0x23 < pcVar4) {
          return iVar7;
        }
      } while( true );
    }
    p_Var3 = xlogging_get_log_function();
    iVar7 = 0x2b;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x2b;
    }
    pcVar9 = "Unexpected size for an UUID string (%lu)";
    iVar5 = 0x2a;
  }
LAB_0012a15f:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uuid.c"
            ,"UUID_from_string",iVar5,1,pcVar9,pcVar4);
  return iVar7;
}

Assistant:

int UUID_from_string(const char* uuid_string, UUID_T* uuid)
{
    int result;

    // Codes_SRS_UUID_09_007: [ If uuid_string or uuid are NULL, UUID_from_string shall return a non-zero value ]
    if (uuid_string == NULL || uuid == NULL)
    {
        LogError("Invalid argument (uuid_string=%p, uuid=%p)", uuid_string, uuid);
        result = MU_FAILURE;
    }
    else
    {
        size_t uuid_string_length = strlen(uuid_string);

        if (uuid_string_length != UUID_STRING_LENGTH)
        {
            LogError("Unexpected size for an UUID string (%lu)", (unsigned long)uuid_string_length);
            result = MU_FAILURE;
        }
        else
        {
            // Codes_SRS_UUID_09_008: [ Each pair of digits in uuid_string, excluding dashes, shall be read as a single HEX value and saved on the respective position in uuid ]
            size_t i, j;
            char* uuid_bytes;

            uuid_bytes = (char *)uuid;
            // Codes_SRS_UUID_09_010: [ If no failures occur, UUID_from_string shall return zero ]
            result = __SUCCESS__;

            for (i = 0, j = 0; i < uuid_string_length; )
            {
                if (uuid_string[i] == '-')
                {
                    if (!MUST_BE_DASH(i))
                    {
                        // Codes_SRS_UUID_09_009: [ If uuid fails to be generated, UUID_from_string shall return a non-zero value ]
                        LogError("Failed decoding UUID string (%lu)", (unsigned long)i);
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        i++;
                    }
                }
                else
                {
                    int higherOrderDigit = HEXA_DIGIT_VAL(uuid_string[i]);
                    int lowerOrderDigit = HEXA_DIGIT_VAL(uuid_string[i + 1]);

#ifdef _MSC_VER
#pragma warning(disable:6328) // warning C6328: Size mismatch
#endif
                    if (higherOrderDigit == -1 || lowerOrderDigit == -1)
#ifdef _MSC_VER
#pragma warning (default:6328)
#endif
                    {
                        // Codes_SRS_UUID_09_009: [ If uuid fails to be generated, UUID_from_string shall return a non-zero value ]
                        LogError("Failed decoding UUID string (%lu)", (unsigned long)i);
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        // Multiplying the higherOrderDigit by 16.
                        uuid_bytes[j] = (char)((higherOrderDigit << 4) + lowerOrderDigit);
                        i += 2;
                        j++;
                    }
                }
            }
        }
    }

    return result;
}